

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void dynamic_suite::test_array_nested_array(void)

{
  undefined1 *this;
  bool bVar1;
  basic_variable<std::allocator<char>> *this_00;
  char *pcVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_390;
  basic_variable<std::allocator<char>_> *local_378;
  iterator local_358;
  iterator local_340;
  iterator local_328;
  iterator local_310;
  undefined1 local_2f1;
  basic_variable<std::allocator<char>_> *local_2f0;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  undefined1 auStack_288 [32];
  basic_variable<std::allocator<char>_> local_268;
  undefined1 local_238 [24];
  variable expect;
  char *msg;
  undefined1 local_1d8 [8];
  variable value;
  undefined1 local_198 [8];
  iarchive in;
  char input [25];
  
  in.member.reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6f72647968225b5b;
  this = &value.storage.field_0x28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,
             (char *)((long)&in.member.reader.stack.c.
                             super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                             ._M_impl + 0x10));
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_198,(view_type *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  boost::archive::detail::interface_iarchive<trial::protocol::json::basic_iarchive<char>>::
  operator>>((interface_iarchive<trial::protocol::json::basic_iarchive<char>> *)local_198,
             (basic_variable<std::allocator<char>_> *)local_1d8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_1d8);
  boost::detail::test_impl
            ("value.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2e9,"void dynamic_suite::test_array_nested_array()",bVar1);
  this_00 = (basic_variable<std::allocator<char>> *)
            trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                      ((basic_variable<std::allocator<char>_> *)local_1d8,0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>(this_00);
  pcVar2 = "void dynamic_suite::test_array_nested_array()";
  boost::detail::test_impl
            ("value[0].is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2ea,"void dynamic_suite::test_array_nested_array()",bVar1);
  local_2f1 = 1;
  auStack_288._24_8_ = &local_268;
  local_2f0 = &local_2e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2f0,"hydrogen");
  local_2f0 = &local_2b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2f0,"helium");
  auStack_288._8_8_ = &local_2e8;
  auStack_288._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_268,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_288 + 8));
  local_2f1 = 0;
  local_238._0_8_ = &local_268;
  local_238._8_8_ = 1;
  init._M_len = (size_type)pcVar2;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10),
             (basic_array<std::allocator<char>_> *)local_238._0_8_,init);
  local_378 = (basic_variable<std::allocator<char>_> *)local_238;
  do {
    local_378 = local_378 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_378);
  } while (local_378 != &local_268);
  local_390 = (basic_variable<std::allocator<char>_> *)auStack_288;
  do {
    local_390 = local_390 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_390);
  } while (local_390 != &local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_310,(basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_328,(basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_340,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_358,(basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x2ee,"void dynamic_suite::test_array_nested_array()",&local_310,&local_328,&local_340
             ,&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_340);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_310);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_238 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive((basic_iarchive<char> *)local_198);
  return;
}

Assistant:

void test_array_nested_array()
{
    const char input[] = "[[\"hydrogen\", \"helium\"]]";
    json::iarchive in(input);
    variable value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value.is<array>());
    TRIAL_PROTOCOL_TEST(value[0].is<array>());
    variable expect = array::make({{ "hydrogen", "helium" }});
    TRIAL_PROTOCOL_TEST_ALL_WITH(value.begin(), value.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}